

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall capnp::DynamicList::Builder::set(Builder *this,uint index,Reader *value)

{
  ReaderFor<double> value_00;
  StructReader other;
  bool bVar1;
  ReaderFor<bool> value_01;
  ReaderFor<signed_char> value_02;
  ReaderFor<unsigned_char> value_03;
  Which WVar2;
  ReaderFor<short> value_04;
  ReaderFor<unsigned_short> value_05;
  ReaderFor<int> value_06;
  ReaderFor<unsigned_int> value_07;
  Type TVar3;
  uint uVar4;
  ReaderFor<long> value_08;
  ReaderFor<unsigned_long> value_09;
  Own<capnp::ClientHook,_std::nullptr_t> *cap;
  ReaderFor<float> value_10;
  ReaderFor<capnp::DynamicEnum> RVar5;
  uint local_3a4;
  Fault local_3a0;
  Fault f_6;
  Fault local_378;
  Fault f_5;
  Schema local_368;
  bool local_35a;
  DebugExpression<bool> local_359;
  undefined1 local_358 [7];
  DebugExpression<bool> _kjCondition_4;
  ReaderFor<capnp::DynamicCapability> capValue;
  Fault f_4;
  Fault f_3;
  Schema local_328;
  EnumSchema local_320;
  undefined1 local_318 [8];
  DebugComparison<capnp::EnumSchema,_capnp::EnumSchema> _kjCondition_3;
  undefined1 local_2e0 [8];
  DynamicEnum enumValue;
  Schema local_2b0;
  Enumerant local_2a8;
  uint16_t local_262;
  undefined8 uStack_260;
  uint16_t rawValue;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  StructBuilder local_230;
  Fault local_208;
  Fault f_2;
  Schema local_1f8;
  StructSchema local_1f0;
  undefined1 local_1e8 [8];
  DebugComparison<capnp::StructSchema,_capnp::StructSchema> _kjCondition_2;
  ReaderFor<capnp::DynamicStruct> structValue;
  Fault local_170;
  Fault f_1;
  Type local_158;
  Type local_148;
  undefined1 local_138 [8];
  DebugComparison<capnp::ListSchema,_capnp::ListSchema> _kjCondition_1;
  ReaderFor<capnp::DynamicList> listValue;
  PointerBuilder local_b0;
  StringPtr local_98;
  PointerBuilder local_88;
  Fault local_60;
  Fault f;
  uint *local_50;
  undefined1 local_48 [8];
  DebugComparison<unsigned_int_&,_unsigned_int> _kjCondition;
  Reader *value_local;
  Builder *pBStack_10;
  uint index_local;
  Builder *this_local;
  
  _kjCondition._32_8_ = value;
  value_local._4_4_ = index;
  pBStack_10 = this;
  local_50 = (uint *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                (uint *)((long)&value_local + 4));
  f.exception._4_4_ = size(this);
  kj::_::DebugExpression<unsigned_int&>::operator<
            ((DebugComparison<unsigned_int_&,_unsigned_int> *)local_48,
             (DebugExpression<unsigned_int&> *)&local_50,(uint *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (bVar1) {
    WVar2 = ListSchema::whichElementType(&this->schema);
    switch(WVar2) {
    case VOID:
      uVar4 = bounded<unsigned_int>(value_local._4_4_);
      DynamicValue::Reader::as<capnp::Void>((Reader *)_kjCondition._32_8_);
      capnp::_::ListBuilder::setDataElement<capnp::Void>(&this->builder,uVar4);
      break;
    case BOOL:
      uVar4 = bounded<unsigned_int>(value_local._4_4_);
      value_01 = DynamicValue::Reader::as<bool>((Reader *)_kjCondition._32_8_);
      capnp::_::ListBuilder::setDataElement<bool>(&this->builder,uVar4,value_01);
      break;
    case INT8:
      uVar4 = bounded<unsigned_int>(value_local._4_4_);
      value_02 = DynamicValue::Reader::as<signed_char>((Reader *)_kjCondition._32_8_);
      capnp::_::ListBuilder::setDataElement<signed_char>(&this->builder,uVar4,value_02);
      break;
    case INT16:
      uVar4 = bounded<unsigned_int>(value_local._4_4_);
      value_04 = DynamicValue::Reader::as<short>((Reader *)_kjCondition._32_8_);
      capnp::_::ListBuilder::setDataElement<short>(&this->builder,uVar4,value_04);
      break;
    case INT32:
      uVar4 = bounded<unsigned_int>(value_local._4_4_);
      value_06 = DynamicValue::Reader::as<int>((Reader *)_kjCondition._32_8_);
      capnp::_::ListBuilder::setDataElement<int>(&this->builder,uVar4,value_06);
      break;
    case INT64:
      uVar4 = bounded<unsigned_int>(value_local._4_4_);
      value_08 = DynamicValue::Reader::as<long>((Reader *)_kjCondition._32_8_);
      capnp::_::ListBuilder::setDataElement<long>(&this->builder,uVar4,value_08);
      break;
    case UINT8:
      uVar4 = bounded<unsigned_int>(value_local._4_4_);
      value_03 = DynamicValue::Reader::as<unsigned_char>((Reader *)_kjCondition._32_8_);
      capnp::_::ListBuilder::setDataElement<unsigned_char>(&this->builder,uVar4,value_03);
      break;
    case UINT16:
      uVar4 = bounded<unsigned_int>(value_local._4_4_);
      value_05 = DynamicValue::Reader::as<unsigned_short>((Reader *)_kjCondition._32_8_);
      capnp::_::ListBuilder::setDataElement<unsigned_short>(&this->builder,uVar4,value_05);
      break;
    case UINT32:
      uVar4 = bounded<unsigned_int>(value_local._4_4_);
      value_07 = DynamicValue::Reader::as<unsigned_int>((Reader *)_kjCondition._32_8_);
      capnp::_::ListBuilder::setDataElement<unsigned_int>(&this->builder,uVar4,value_07);
      break;
    case UINT64:
      uVar4 = bounded<unsigned_int>(value_local._4_4_);
      value_09 = DynamicValue::Reader::as<unsigned_long>((Reader *)_kjCondition._32_8_);
      capnp::_::ListBuilder::setDataElement<unsigned_long>(&this->builder,uVar4,value_09);
      break;
    case FLOAT32:
      uVar4 = bounded<unsigned_int>(value_local._4_4_);
      value_10 = DynamicValue::Reader::as<float>((Reader *)_kjCondition._32_8_);
      capnp::_::ListBuilder::setDataElement<float>(&this->builder,uVar4,value_10);
      break;
    case FLOAT64:
      uVar4 = bounded<unsigned_int>(value_local._4_4_);
      value_00 = DynamicValue::Reader::as<double>((Reader *)_kjCondition._32_8_);
      capnp::_::ListBuilder::setDataElement<double>(&this->builder,uVar4,value_00);
      break;
    case TEXT:
      uVar4 = bounded<unsigned_int>(value_local._4_4_);
      capnp::_::ListBuilder::getPointerElement(&local_88,&this->builder,uVar4);
      local_98.content =
           (ArrayPtr<const_char>)
           DynamicValue::Reader::as<capnp::Text>((Reader *)_kjCondition._32_8_);
      capnp::_::PointerBuilder::setBlob<capnp::Text>(&local_88,(Reader)local_98.content);
      break;
    case DATA:
      uVar4 = bounded<unsigned_int>(value_local._4_4_);
      capnp::_::ListBuilder::getPointerElement(&local_b0,&this->builder,uVar4);
      join_0x00000010_0x00000000_ =
           (ArrayPtr<const_unsigned_char>)
           DynamicValue::Reader::as<capnp::Data>((Reader *)_kjCondition._32_8_);
      capnp::_::PointerBuilder::setBlob<capnp::Data>(&local_b0,(Reader)join_0x00000010_0x00000000_);
      break;
    case LIST:
      DynamicValue::Reader::as<capnp::DynamicList>
                ((ReaderFor<capnp::DynamicList> *)&_kjCondition_1.result,
                 (Reader *)_kjCondition._32_8_);
      local_158 = (Type)DynamicList::Reader::getSchema((Reader *)&_kjCondition_1.result);
      local_148 = (Type)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                   (ListSchema *)&local_158);
      _f_1 = (Type)ListSchema::getListElementType(&this->schema);
      kj::_::DebugExpression<capnp::ListSchema>::operator==
                ((DebugComparison<capnp::ListSchema,_capnp::ListSchema> *)local_138,
                 (DebugExpression<capnp::ListSchema> *)&local_148,(ListSchema *)&f_1);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_138);
      if (bVar1) {
        uVar4 = bounded<unsigned_int>(value_local._4_4_);
        capnp::_::ListBuilder::getPointerElement
                  ((PointerBuilder *)&structValue.reader.nestingLimit,&this->builder,uVar4);
        capnp::_::PointerBuilder::setList
                  ((PointerBuilder *)&structValue.reader.nestingLimit,
                   (ListReader *)&listValue.schema.elementType.field_4,false);
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::ListSchema,capnp::ListSchema>&,char_const(&)[21]>
                  (&local_170,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x4ab,FAILED,"listValue.getSchema() == schema.getListElementType()",
                   "_kjCondition,\"Value type mismatch.\"",
                   (DebugComparison<capnp::ListSchema,_capnp::ListSchema> *)local_138,
                   (char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::~Fault(&local_170);
      }
      break;
    case ENUM:
      TVar3 = DynamicValue::Reader::getType((Reader *)_kjCondition._32_8_);
      if (TVar3 == TEXT) {
        local_2b0.raw = (RawBrandedSchema *)ListSchema::getEnumElementType(&this->schema);
        join_0x00000010_0x00000000_ =
             (ArrayPtr<const_char>)
             DynamicValue::Reader::as<capnp::Text>((Reader *)_kjCondition._32_8_);
        EnumSchema::getEnumerantByName
                  (&local_2a8,(EnumSchema *)&local_2b0,(StringPtr)join_0x00000010_0x00000000_);
        local_262 = EnumSchema::Enumerant::getOrdinal(&local_2a8);
      }
      else {
        RVar5 = DynamicValue::Reader::as<capnp::DynamicEnum>((Reader *)_kjCondition._32_8_);
        _kjCondition_3._32_8_ = RVar5.schema.super_Schema.raw;
        enumValue.schema.super_Schema.raw._0_2_ = RVar5.value;
        local_2e0 = (undefined1  [8])_kjCondition_3._32_8_;
        local_328.raw = (RawBrandedSchema *)ListSchema::getEnumElementType(&this->schema);
        local_320.super_Schema.raw =
             (Schema)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                (EnumSchema *)&local_328);
        f_3.exception = (Exception *)DynamicEnum::getSchema((DynamicEnum *)local_2e0);
        kj::_::DebugExpression<capnp::EnumSchema>::operator==
                  ((DebugComparison<capnp::EnumSchema,_capnp::EnumSchema> *)local_318,
                   (DebugExpression<capnp::EnumSchema> *)&local_320,(EnumSchema *)&f_3);
        bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_318);
        if (!bVar1) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::EnumSchema,capnp::EnumSchema>&,char_const(&)[54]>
                    (&f_4,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                     ,0x4c3,FAILED,"schema.getEnumElementType() == enumValue.getSchema()",
                     "_kjCondition,\"Type mismatch when using DynamicList::Builder::set().\"",
                     (DebugComparison<capnp::EnumSchema,_capnp::EnumSchema> *)local_318,
                     (char (*) [54])"Type mismatch when using DynamicList::Builder::set().");
          kj::_::Debug::Fault::~Fault(&f_4);
          return;
        }
        local_262 = DynamicEnum::getRaw((DynamicEnum *)local_2e0);
      }
      uVar4 = bounded<unsigned_int>(value_local._4_4_);
      capnp::_::ListBuilder::setDataElement<unsigned_short>(&this->builder,uVar4,local_262);
      break;
    case STRUCT:
      DynamicValue::Reader::as<capnp::DynamicStruct>
                ((ReaderFor<capnp::DynamicStruct> *)&_kjCondition_2.result,
                 (Reader *)_kjCondition._32_8_);
      local_1f8.raw =
           (RawBrandedSchema *)DynamicStruct::Reader::getSchema((Reader *)&_kjCondition_2.result);
      local_1f0.super_Schema.raw =
           (Schema)kj::_::DebugExpressionStart::operator<<
                             ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                              (StructSchema *)&local_1f8);
      f_2.exception = (Exception *)ListSchema::getStructElementType(&this->schema);
      kj::_::DebugExpression<capnp::StructSchema>::operator==
                ((DebugComparison<capnp::StructSchema,_capnp::StructSchema> *)local_1e8,
                 (DebugExpression<capnp::StructSchema> *)&local_1f0,(StructSchema *)&f_2);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1e8);
      if (bVar1) {
        uVar4 = bounded<unsigned_int>(value_local._4_4_);
        capnp::_::ListBuilder::getStructElement(&local_230,&this->builder,uVar4);
        memcpy(&stack0xfffffffffffffda0,&structValue,0x30);
        other.capTable = (CapTableReader *)uStack_258;
        other.segment = (SegmentReader *)uStack_260;
        other.data = (void *)local_250;
        other.pointers = (WirePointer *)uStack_248;
        other.dataSize = (undefined4)local_240;
        other.pointerCount = local_240._4_2_;
        other._38_2_ = local_240._6_2_;
        other._40_8_ = uStack_238;
        capnp::_::StructBuilder::copyContentFrom(&local_230,other);
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::StructSchema,capnp::StructSchema>&,char_const(&)[21]>
                  (&local_208,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x4b4,FAILED,"structValue.getSchema() == schema.getStructElementType()",
                   "_kjCondition,\"Value type mismatch.\"",
                   (DebugComparison<capnp::StructSchema,_capnp::StructSchema> *)local_1e8,
                   (char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::~Fault(&local_208);
      }
      break;
    case INTERFACE:
      DynamicValue::Reader::as<capnp::DynamicCapability>
                ((ReaderFor<capnp::DynamicCapability> *)local_358,(Reader *)_kjCondition._32_8_);
      local_368.raw =
           (RawBrandedSchema *)
           DynamicCapability::Client::getSchema((ReaderFor<capnp::DynamicCapability> *)local_358);
      f_5.exception = (Exception *)ListSchema::getInterfaceElementType(&this->schema);
      local_35a = InterfaceSchema::extends
                            ((InterfaceSchema *)&local_368,(InterfaceSchema)f_5.exception);
      local_359 = kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_35a);
      bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_359);
      if (bVar1) {
        uVar4 = bounded<unsigned_int>(value_local._4_4_);
        capnp::_::ListBuilder::getPointerElement((PointerBuilder *)&f_6,&this->builder,uVar4);
        cap = kj::mv<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                        ((Own<capnp::ClientHook,_std::nullptr_t> *)local_358);
        capnp::_::PointerBuilder::setCapability((PointerBuilder *)&f_6,cap);
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[21]>
                  (&local_378,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x4d4,FAILED,"capValue.getSchema().extends(schema.getInterfaceElementType())",
                   "_kjCondition,\"Value type mismatch.\"",&local_359,
                   (char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::~Fault(&local_378);
      }
      DynamicCapability::Client::~Client((Client *)local_358);
      break;
    case ANY_POINTER:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
                ((Fault *)&capValue.schema,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x4cd,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
                 (char (*) [32])"List(AnyPointer) not supported.");
      kj::_::Debug::Fault::~Fault((Fault *)&capValue.schema);
      break;
    default:
      WVar2 = ListSchema::whichElementType(&this->schema);
      local_3a4 = (uint)WVar2;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34],unsigned_int>
                (&local_3a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
                 ,0x4dc,FAILED,(char *)0x0,
                 "\"can\'t set element of unknown type\", (uint)schema.whichElementType()",
                 (char (*) [34])"can\'t set element of unknown type",&local_3a4);
      kj::_::Debug::Fault::~Fault(&local_3a0);
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int>&,char_const(&)[26]>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x48a,FAILED,"index < size()","_kjCondition,\"List index out-of-bounds.\"",
               (DebugComparison<unsigned_int_&,_unsigned_int> *)local_48,
               (char (*) [26])"List index out-of-bounds.");
    kj::_::Debug::Fault::~Fault(&local_60);
  }
  return;
}

Assistant:

void DynamicList::Builder::set(uint index, const DynamicValue::Reader& value) {
  KJ_REQUIRE(index < size(), "List index out-of-bounds.") {
    return;
  }

  switch (schema.whichElementType()) {
#define HANDLE_TYPE(name, discrim, typeName) \
    case schema::Type::discrim: \
      builder.setDataElement<typeName>(bounded(index) * ELEMENTS, value.as<typeName>()); \
      return;

    HANDLE_TYPE(void, VOID, Void)
    HANDLE_TYPE(bool, BOOL, bool)
    HANDLE_TYPE(int8, INT8, int8_t)
    HANDLE_TYPE(int16, INT16, int16_t)
    HANDLE_TYPE(int32, INT32, int32_t)
    HANDLE_TYPE(int64, INT64, int64_t)
    HANDLE_TYPE(uint8, UINT8, uint8_t)
    HANDLE_TYPE(uint16, UINT16, uint16_t)
    HANDLE_TYPE(uint32, UINT32, uint32_t)
    HANDLE_TYPE(uint64, UINT64, uint64_t)
    HANDLE_TYPE(float32, FLOAT32, float)
    HANDLE_TYPE(float64, FLOAT64, double)
#undef HANDLE_TYPE

    case schema::Type::TEXT:
      builder.getPointerElement(bounded(index) * ELEMENTS).setBlob<Text>(value.as<Text>());
      return;
    case schema::Type::DATA:
      builder.getPointerElement(bounded(index) * ELEMENTS).setBlob<Data>(value.as<Data>());
      return;

    case schema::Type::LIST: {
      auto listValue = value.as<DynamicList>();
      KJ_REQUIRE(listValue.getSchema() == schema.getListElementType(), "Value type mismatch.") {
        return;
      }
      builder.getPointerElement(bounded(index) * ELEMENTS).setList(listValue.reader);
      return;
    }

    case schema::Type::STRUCT: {
      auto structValue = value.as<DynamicStruct>();
      KJ_REQUIRE(structValue.getSchema() == schema.getStructElementType(), "Value type mismatch.") {
        return;
      }
      builder.getStructElement(bounded(index) * ELEMENTS).copyContentFrom(structValue.reader);
      return;
    }

    case schema::Type::ENUM: {
      uint16_t rawValue;
      if (value.getType() == DynamicValue::TEXT) {
        // Convert from text.
        rawValue = schema.getEnumElementType().getEnumerantByName(value.as<Text>()).getOrdinal();
      } else {
        DynamicEnum enumValue = value.as<DynamicEnum>();
        KJ_REQUIRE(schema.getEnumElementType() == enumValue.getSchema(),
                   "Type mismatch when using DynamicList::Builder::set().") {
          return;
        }
        rawValue = enumValue.getRaw();
      }
      builder.setDataElement<uint16_t>(bounded(index) * ELEMENTS, rawValue);
      return;
    }

    case schema::Type::ANY_POINTER:
      KJ_FAIL_ASSERT("List(AnyPointer) not supported.") {
        return;
      }

    case schema::Type::INTERFACE: {
      auto capValue = value.as<DynamicCapability>();
      KJ_REQUIRE(capValue.getSchema().extends(schema.getInterfaceElementType()),
                 "Value type mismatch.") {
        return;
      }
      builder.getPointerElement(bounded(index) * ELEMENTS).setCapability(kj::mv(capValue.hook));
      return;
    }
  }

  KJ_FAIL_REQUIRE("can't set element of unknown type", (uint)schema.whichElementType()) {
    return;
  }
}